

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O0

void __thiscall dlib::logger_helper_stuff::helper::helper(helper *this)

{
  ostringstream sout;
  uint64 in_stack_fffffffffffffe58;
  log_level *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  ostream *in_stack_fffffffffffffe70;
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffe60,"some_name",(allocator *)&stack0xfffffffffffffe5f);
  print_default_logger_header
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe5f);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

helper()
            {
                std::ostringstream sout;
                print_default_logger_header(sout,"some_name",LDEBUG,0);
            }